

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiSmokeTests.cpp
# Opt level: O3

void __thiscall
vkt::api::anon_unknown_1::RefVertexShader::shadeVertices
          (RefVertexShader *this,VertexAttrib *inputs,VertexPacket **packets,int numPackets)

{
  VertexPacket *pVVar1;
  ulong uVar2;
  Vec4 local_38;
  
  if (0 < numPackets) {
    uVar2 = 0;
    do {
      local_38.m_data[0] = 0.0;
      local_38.m_data[1] = 0.0;
      local_38.m_data[2] = 0.0;
      local_38.m_data[3] = 0.0;
      rr::readVertexAttrib(&local_38,inputs,packets[uVar2]->instanceNdx,packets[uVar2]->vertexNdx);
      pVVar1 = packets[uVar2];
      *(undefined8 *)(pVVar1->position).m_data = local_38.m_data._0_8_;
      *(undefined8 *)((pVVar1->position).m_data + 2) = local_38.m_data._8_8_;
      uVar2 = uVar2 + 1;
    } while ((uint)numPackets != uVar2);
  }
  return;
}

Assistant:

void shadeVertices (const rr::VertexAttrib* inputs, rr::VertexPacket* const* packets, const int numPackets) const
	{
		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		{
			packets[packetNdx]->position = rr::readVertexAttribFloat(inputs[0],
																	 packets[packetNdx]->instanceNdx,
																	 packets[packetNdx]->vertexNdx);
		}
	}